

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMSVC60LinkLineComputer.cxx
# Opt level: O0

string * __thiscall
cmMSVC60LinkLineComputer::ConvertToLinkReference
          (string *__return_storage_ptr__,cmMSVC60LinkLineComputer *this,string *lib)

{
  string *lib_local;
  cmMSVC60LinkLineComputer *this_local;
  
  cmLinkLineComputer::ConvertToLinkReference
            (__return_storage_ptr__,&this->super_cmLinkLineComputer,lib);
  return __return_storage_ptr__;
}

Assistant:

std::string cmMSVC60LinkLineComputer::ConvertToLinkReference(
  std::string const& lib) const
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  // Work-ardound command line parsing limitations in MSVC 6.0
  // Search for the last space.
  std::string::size_type pos = lib.rfind(' ');
  if (pos != std::string::npos) {
    // Find the slash after the last space, if any.
    pos = lib.find('/', pos);

    // Convert the portion of the path with a space to a short path.
    std::string sp;
    if (cmSystemTools::GetShortPath(lib.substr(0, pos).c_str(), sp)) {
      // Append the rest of the path with no space.
      sp += lib.substr(pos);
      return sp;
    }
  }
#endif

  return this->cmLinkLineComputer::ConvertToLinkReference(lib);
}